

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

void __thiscall
so_5::disp::prio_dedicated_threads::one_per_prio::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::disp_data_source_t::distribute_value_for_work_thread
          (disp_data_source_t *this,mbox_t *mbox,priority_t priority,size_t agents_count,
          work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>
          *wt)

{
  intrusive_ptr_t<so_5::abstract_message_box_t> *piVar1;
  char *pcVar2;
  ostream *poVar3;
  size_t sVar4;
  suffix_t local_220;
  size_t local_218;
  suffix_t local_210;
  string local_208 [36];
  undefined1 local_1e4 [8];
  prefix_t prefix;
  ostringstream local_1a8 [8];
  ostringstream ss;
  work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>
  *wt_local;
  size_t agents_count_local;
  mbox_t *pmStack_18;
  priority_t priority_local;
  mbox_t *mbox_local;
  disp_data_source_t *this_local;
  
  wt_local = (work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>
              *)agents_count;
  agents_count_local._7_1_ = priority;
  pmStack_18 = mbox;
  mbox_local = (mbox_t *)this;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pcVar2 = stats::prefix_t::c_str(&this->m_base_prefix);
  poVar3 = std::operator<<((ostream *)local_1a8,pcVar2);
  poVar3 = std::operator<<(poVar3,"/wt-p");
  sVar4 = to_size_t(agents_count_local._7_1_);
  std::ostream::operator<<(poVar3,sVar4);
  std::__cxx11::ostringstream::str();
  stats::prefix_t::prefix_t((prefix_t *)local_1e4,local_208);
  std::__cxx11::string::~string((string *)local_208);
  piVar1 = pmStack_18;
  local_210 = stats::suffixes::work_thread_queue_size();
  local_218 = reuse::work_thread::details::
              work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>
              ::demands_count(wt);
  send<so_5::stats::messages::quantity<unsigned_long>,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::stats::prefix_t_const&,so_5::stats::suffix_t,unsigned_long>
            (piVar1,(prefix_t *)local_1e4,&local_210,&local_218);
  piVar1 = pmStack_18;
  local_220 = stats::suffixes::agent_count();
  send<so_5::stats::messages::quantity<unsigned_long>,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::stats::prefix_t_const&,so_5::stats::suffix_t,unsigned_long&>
            (piVar1,(prefix_t *)local_1e4,&local_220,(unsigned_long *)&wt_local);
  anon_unknown_7::send_thread_activity_stats(pmStack_18,(prefix_t *)local_1e4,wt);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return;
}

Assistant:

void
				distribute_value_for_work_thread(
					const mbox_t & mbox,
					priority_t priority,
					std::size_t agents_count,
					WORK_THREAD & wt )
					{
						std::ostringstream ss;
						ss << m_base_prefix.c_str() << "/wt-p" << to_size_t(priority);

						const stats::prefix_t prefix{ ss.str() };

						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								prefix,
								stats::suffixes::work_thread_queue_size(),
								wt.demands_count() );

						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								prefix,
								stats::suffixes::agent_count(),
								agents_count );

						send_thread_activity_stats( mbox, prefix, wt );
					}